

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::MergePartialFromCodedStream
          (MessageLite *this,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  uint uVar4;
  ParseContext ctx;
  ZeroCopyCodedInputStream zcis;
  EpsCopyInputStream local_a0;
  int local_48;
  undefined4 local_44;
  DescriptorPool *local_40;
  MessageFactory *pMStack_38;
  ZeroCopyInputStream local_30;
  CodedInputStream *local_28;
  
  local_30._vptr_ZeroCopyInputStream = (_func_int **)&PTR__ZeroCopyInputStream_0062dde8;
  local_48 = input->recursion_budget_;
  local_a0.aliasing_ = (uintptr_t)input->aliasing_enabled_;
  local_a0.buffer_[0x18] = '\0';
  local_a0.buffer_[0x19] = '\0';
  local_a0.buffer_[0x1a] = '\0';
  local_a0.buffer_[0x1b] = '\0';
  local_a0.buffer_[0x1c] = '\0';
  local_a0.buffer_[0x1d] = '\0';
  local_a0.buffer_[0x1e] = '\0';
  local_a0.buffer_[0x1f] = '\0';
  local_a0.buffer_[8] = '\0';
  local_a0.buffer_[9] = '\0';
  local_a0.buffer_[10] = '\0';
  local_a0.buffer_[0xb] = '\0';
  local_a0.buffer_[0xc] = '\0';
  local_a0.buffer_[0xd] = '\0';
  local_a0.buffer_[0xe] = '\0';
  local_a0.buffer_[0xf] = '\0';
  local_a0.buffer_[0x10] = '\0';
  local_a0.buffer_[0x11] = '\0';
  local_a0.buffer_[0x12] = '\0';
  local_a0.buffer_[0x13] = '\0';
  local_a0.buffer_[0x14] = '\0';
  local_a0.buffer_[0x15] = '\0';
  local_a0.buffer_[0x16] = '\0';
  local_a0.buffer_[0x17] = '\0';
  local_a0.zcis_ = (ZeroCopyInputStream *)0x0;
  local_a0.buffer_[0] = '\0';
  local_a0.buffer_[1] = '\0';
  local_a0.buffer_[2] = '\0';
  local_a0.buffer_[3] = '\0';
  local_a0.buffer_[4] = '\0';
  local_a0.buffer_[5] = '\0';
  local_a0.buffer_[6] = '\0';
  local_a0.buffer_[7] = '\0';
  local_a0.last_tag_minus_1_ = 0;
  local_a0.overall_limit_ = 0x7fffffff;
  local_44 = 0x80000000;
  local_40 = (DescriptorPool *)0x0;
  pMStack_38 = (MessageFactory *)0x0;
  local_28 = input;
  pcVar3 = internal::EpsCopyInputStream::InitFrom(&local_a0,&local_30);
  local_44 = 0;
  local_40 = input->extension_pool_;
  pMStack_38 = input->extension_factory_;
  iVar2 = (*this->_vptr_MessageLite[0xd])(this,pcVar3,&local_a0);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  if (pcVar3 == (char *)0x0) {
LAB_0016af51:
    bVar1 = false;
  }
  else {
    if (local_a0.next_chunk_ == local_a0.buffer_) {
      uVar4 = ((int)local_a0.buffer_end_ - iVar2) + 0x10;
    }
    else {
      uVar4 = ((int)local_a0.buffer_end_ - iVar2) + local_a0.size_;
    }
    if (0 < (int)uVar4) {
      (*(local_a0.zcis_)->_vptr_ZeroCopyInputStream[3])(local_a0.zcis_,(ulong)uVar4);
      local_a0._80_8_ = local_a0._80_8_ & 0xffffffff;
    }
    if (local_a0.last_tag_minus_1_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if ((local_a0.limit_end_ < pcVar3) &&
         ((local_a0.next_chunk_ == (char *)0x0 ||
          ((long)local_a0.limit_ <
           (long)pcVar3 - CONCAT44(local_a0.buffer_end_._4_4_,(int)local_a0.buffer_end_)))))
      goto LAB_0016af51;
      input->last_tag_ = local_a0.last_tag_minus_1_ + 1;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool MessageLite::MergePartialFromCodedStream(io::CodedInputStream* input) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
    return true;
  }
  input->SetConsumed();
  return true;
}